

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O0

void __thiscall Permutazione::differenza(Permutazione *this,Permutazione *p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__dest;
  unsigned_short *puVar3;
  ushort local_2c;
  ushort local_2a;
  unsigned_short k_1;
  unsigned_short k;
  unsigned_short *thisCopia;
  unsigned_short *pCopia;
  Permutazione *p_local;
  Permutazione *this_local;
  
  auVar1 = ZEXT216(this->dimensione) * ZEXT816(2);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __dest = operator_new__(uVar2);
  auVar1 = ZEXT216(this->dimensione) * ZEXT816(2);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (unsigned_short *)operator_new__(uVar2);
  memcpy(__dest,p->individuo,(ulong)this->dimensione << 1);
  for (local_2a = 0; local_2a < this->dimensione; local_2a = local_2a + 1) {
    *(ushort *)((long)__dest + (ulong)p->individuo[local_2a] * 2) = local_2a;
  }
  for (local_2c = 0; local_2c < this->dimensione; local_2c = local_2c + 1) {
    puVar3[local_2c] = *(unsigned_short *)((long)__dest + (ulong)this->individuo[local_2c] * 2);
  }
  if (this->individuo != (unsigned_short *)0x0) {
    operator_delete__(this->individuo);
  }
  if (__dest != (void *)0x0) {
    operator_delete__(__dest);
  }
  this->individuo = puVar3;
  return;
}

Assistant:

void Permutazione::differenza(Permutazione* p) {

	unsigned short* pCopia = new unsigned short[dimensione];
	unsigned short* thisCopia = new unsigned short[dimensione];
	
	//copiamo l'individuo p
	memcpy(pCopia, p->individuo, sizeof(unsigned short) * dimensione);

	//p^-1 
	for (unsigned short k = 0; k < dimensione; k++) {
		pCopia[p->individuo[k]] = k;
	}

	//p^-1 + this
	for (unsigned short k = 0; k < dimensione; k++) {
		thisCopia[k] = pCopia[this->individuo[k]];
	}

	//assegnamolo a this
	delete[] this->individuo;
	delete[] pCopia;
	this->individuo = thisCopia;
}